

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O1

void __thiscall
slang::ast::ElabSystemTaskSymbol::serializeTo(ElabSystemTaskSymbol *this,ASTSerializer *serializer)

{
  size_t __n;
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> msg;
  _Storage<std::basic_string_view<char,_std::char_traits<char>_>,_true> local_30;
  char local_20;
  
  __n = strlen(*(char **)(toString(slang::ast::ElabSystemTaskKind)::strings +
                         (long)(int)this->taskKind * 8));
  ASTSerializer::write(serializer,8,"taskKind",__n);
  getMessage((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)&local_30._M_value,
             this);
  if (local_20 == '\x01') {
    ASTSerializer::write(serializer,7,"message",local_30._M_value._M_len);
  }
  if (this->assertCondition != (Expression *)0x0) {
    ASTSerializer::write(serializer,0xf,"assertCondition",(size_t)this->assertCondition);
    return;
  }
  return;
}

Assistant:

void ElabSystemTaskSymbol::serializeTo(ASTSerializer& serializer) const {
    serializer.write("taskKind", toString(taskKind));

    if (auto msg = getMessage())
        serializer.write("message", *msg);

    if (assertCondition)
        serializer.write("assertCondition", *assertCondition);
}